

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O2

Id __thiscall QAccessibleCache::idForObject(QAccessibleCache *this,QObject *obj)

{
  QMetaObject *pQVar1;
  iterator iVar2;
  iterator iVar3;
  Id unaff_EBP;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_> QStack_48;
  QObject *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = obj;
  if (obj != (QObject *)0x0) {
    pQVar1 = (QMetaObject *)(*(code *)**(undefined8 **)obj)(obj);
    QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::valuesImpl<QObject*>
              ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&QStack_48,
               (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)(this + 0x20),
               &local_30);
    iVar2 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin
                      ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&QStack_48);
    iVar3 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end
                      ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&QStack_48);
    for (; iVar2.i != iVar3.i; iVar2.i = iVar2.i + 1) {
      if ((iVar2.i)->second == pQVar1) {
        unaff_EBP = (iVar2.i)->first;
        break;
      }
    }
    QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_>::~QArrayDataPointer(&QStack_48)
    ;
    if (iVar2.i != iVar3.i) goto LAB_004fa578;
  }
  unaff_EBP = 0;
LAB_004fa578:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return unaff_EBP;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::Id QAccessibleCache::idForObject(QObject *obj) const
{
    if (obj) {
        const QMetaObject *mo = obj->metaObject();
        for (auto pair : objectToId.values(obj)) {
            if (pair.second == mo) {
                return pair.first;
            }
        }
    }
    return 0;
}